

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_mem(lua_State *L)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  lua_State *L_local;
  
  if (L->status == '\x06') {
    lj_vm_unwind_c(L->cframe);
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar2 = lj_err_str(L,LJ_ERR_ERRMEM);
  pTVar1->u64 = (ulong)pGVar2 | 0xfffd800000000000;
  lj_err_throw(L,4);
}

Assistant:

LJ_NOINLINE void lj_err_mem(lua_State *L)
{
  if (L->status == LUA_ERRERR+1)  /* Don't touch the stack during lua_open. */
    lj_vm_unwind_c(L->cframe, LUA_ERRMEM);
  setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRMEM));
  lj_err_throw(L, LUA_ERRMEM);
}